

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,int value)

{
  value_type vVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  value_type *pvVar8;
  size_t sVar9;
  value_type vVar10;
  value_type *pvVar11;
  ulong uVar12;
  byte bVar13;
  long lVar14;
  char local_18 [3];
  value_type avStack_15 [13];
  
  uVar6 = (ulong)(uint)-value;
  if (0 < value) {
    uVar6 = (ulong)(uint)value;
  }
  uVar4 = (uint)uVar6;
  uVar2 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar2 = (uVar2 - (uVar4 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar2 * 4))) + 1;
  uVar3 = (ulong)uVar2;
  if (value < 0) {
    pcVar7 = (this->out_).super_truncating_iterator_base<char_*>.out_;
    uVar12 = (this->out_).super_truncating_iterator_base<char_*>.count_;
    (this->out_).super_truncating_iterator_base<char_*>.count_ = uVar12 + 1;
    if (uVar12 < (this->out_).super_truncating_iterator_base<char_*>.limit_) {
      (this->out_).super_truncating_iterator_base<char_*>.out_ = pcVar7 + 1;
    }
    else {
      pcVar7 = local_18;
    }
    *pcVar7 = '-';
  }
  pvVar11 = avStack_15 + uVar3;
  if (99 < uVar4) {
    do {
      uVar5 = (uint)uVar6;
      uVar4 = (uint)(uVar6 / 100);
      uVar6 = uVar6 / 100;
      *(undefined2 *)(pvVar11 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar5 + (int)uVar6 * -100) * 2);
      pvVar11 = pvVar11 + -2;
    } while (9999 < uVar5);
  }
  pvVar8 = (this->out_).super_truncating_iterator_base<char_*>.out_;
  uVar6 = (this->out_).super_truncating_iterator_base<char_*>.limit_;
  sVar9 = (this->out_).super_truncating_iterator_base<char_*>.count_;
  vVar10 = (this->out_).blackhole_;
  if (uVar4 < 10) {
    bVar13 = (byte)uVar4 | 0x30;
    lVar14 = -1;
  }
  else {
    pvVar11[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar4 * 2 & 0xffffffff) + 1];
    bVar13 = internal::basic_data<void>::DIGITS[(ulong)uVar4 * 2];
    lVar14 = -2;
  }
  pvVar11[lVar14] = bVar13;
  if (0 < (int)uVar2) {
    uVar12 = 0;
    do {
      vVar1 = avStack_15[uVar12];
      if (sVar9 + uVar12 < uVar6) {
        *pvVar8 = avStack_15[uVar12];
        pvVar8 = pvVar8 + 1;
        vVar1 = vVar10;
      }
      vVar10 = vVar1;
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
    sVar9 = sVar9 + uVar3;
  }
  (this->out_).super_truncating_iterator_base<char_*>.out_ = pvVar8;
  (this->out_).super_truncating_iterator_base<char_*>.limit_ = uVar6;
  (this->out_).super_truncating_iterator_base<char_*>.count_ = sVar9;
  (this->out_).blackhole_ = vVar10;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }